

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_packing.cpp
# Opt level: O0

double __thiscall packing::AssignedProtos::relSizeOf(AssignedProtos *this,ProtoPalette *protoPal)

{
  anon_class_16_2_f7a07050_for__M_pred __pred;
  difference_type dVar1;
  const_iterator __first;
  const_iterator __last;
  difference_type n;
  const_iterator pvStack_38;
  uint16_t color;
  const_iterator __end2;
  const_iterator __begin2;
  ProtoPalette *__range2;
  double relSize;
  ProtoPalette *protoPal_local;
  AssignedProtos *this_local;
  
  __range2 = (ProtoPalette *)0x0;
  __begin2 = (const_iterator)protoPal;
  relSize = (double)protoPal;
  protoPal_local = (ProtoPalette *)this;
  __end2 = ProtoPalette::begin(protoPal);
  pvStack_38 = ProtoPalette::end((ProtoPalette *)__begin2);
  for (; __end2 != pvStack_38; __end2 = __end2 + 1) {
    n._6_2_ = *__end2;
    __first = begin(this);
    __last = end(this);
    __pred.color = (uint16_t *)((long)&n + 6);
    __pred.this = this;
    dVar1 = std::
            count_if<packing::AssignedProtos::Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>const*,std::vector<std::optional<packing::ProtoPalAttrs>,std::allocator<std::optional<packing::ProtoPalAttrs>>>>,std::add_const_t>,packing::AssignedProtos::relSizeOf(ProtoPalette_const&)const::_lambda(packing::ProtoPalAttrs_const&)_1_>
                      (__first,__last,__pred);
    __range2 = (ProtoPalette *)(1.0 / (double)(dVar1 + 1) + (double)__range2);
  }
  return (double)__range2;
}

Assistant:

double relSizeOf(ProtoPalette const &protoPal) const {
		// NOTE: this function must not call `uniqueColors`, or one of its callers will break!
		double relSize = 0.;
		for (uint16_t color : protoPal) {
			auto n = std::count_if(begin(), end(), [this, &color](ProtoPalAttrs const &attrs) {
				ProtoPalette const &pal = (*_protoPals)[attrs.protoPalIndex];
				return std::find(pal.begin(), pal.end(), color) != pal.end();
			});
			// NOTE: The paper and the associated code disagree on this: the code has
			// this `1 +`, whereas the paper does not; its lack causes a division by 0
			// if the symbol is not found anywhere, so I'm assuming the paper is wrong.
			relSize += 1. / (1 + n);
		}
		return relSize;
	}